

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjInit(jx9_vm *pVm,jx9_value *pObj)

{
  sxi32 extraout_EAX;
  
  SyZero(pObj,0x40);
  pObj->pVm = pVm;
  (pObj->sBlob).pBlob = (void *)0x0;
  (pObj->sBlob).nByte = 0;
  (pObj->sBlob).mByte = 0;
  (pObj->sBlob).pAllocator = &pVm->sAllocator;
  (pObj->sBlob).nFlags = 0;
  pObj->iFlags = 0x20;
  return extraout_EAX;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjInit(jx9_vm *pVm, jx9_value *pObj)
{
	/* Zero the structure */
	SyZero(pObj, sizeof(jx9_value));
	/* Initialize fields */
	pObj->pVm = pVm;
	SyBlobInit(&pObj->sBlob, &pVm->sAllocator);
	/* Set the NULL type */
	pObj->iFlags = MEMOBJ_NULL;
	return SXRET_OK;
}